

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

void __thiscall
chaiscript::ChaiScript_Basic::build_eval_system
          (ChaiScript_Basic *this,ModulePtr *t_lib,
          vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *t_opts)

{
  bool bVar1;
  byte local_851;
  byte local_829;
  allocator<char> local_749;
  string local_748;
  anon_class_8_1_8991fb9c_for_m_f local_728;
  Proxy_Function local_720;
  allocator<char> local_709;
  string local_708;
  anon_class_8_1_8991fb9c_for_m_f local_6e8;
  Proxy_Function local_6e0;
  allocator<char> local_6c9;
  string local_6c8;
  anon_class_8_1_8991fb9c_for_m_f local_6a8;
  Proxy_Function local_6a0;
  allocator<char> local_689;
  string local_688;
  anon_class_8_1_8991fb9c_for_m_f local_668;
  Proxy_Function local_660;
  allocator<char> local_649;
  string local_648;
  anon_class_8_1_8991fb9c_for_m_f local_628;
  Proxy_Function local_620;
  allocator<char> local_609;
  string local_608;
  anon_class_8_1_8991fb9c_for_m_f local_5e8;
  Proxy_Function local_5e0;
  allocator<char> local_5c9;
  string local_5c8;
  anon_class_8_1_8991fb9c_for_m_f local_5a8;
  Proxy_Function local_5a0;
  allocator<char> local_589;
  string local_588;
  anon_class_8_1_8991fb9c_for_m_f local_568;
  Proxy_Function local_560;
  allocator<char> local_549;
  string local_548;
  anon_class_8_1_8991fb9c_for_m_f local_528;
  Proxy_Function local_520;
  allocator<char> local_509;
  string local_508;
  anon_class_8_1_8991fb9c_for_m_f local_4e8;
  Proxy_Function local_4e0;
  allocator<char> local_4c9;
  string local_4c8;
  anon_class_8_1_8991fb9c_for_m_f local_4a8;
  Proxy_Function local_4a0;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_490;
  Options local_484;
  Options *local_480;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_478;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_470;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_468;
  Options local_45c;
  Options *local_458;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_450;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_448;
  allocator<char> local_439;
  string local_438;
  anon_class_8_1_8991fb9c_for_m_f local_418;
  Proxy_Function local_410;
  allocator<char> local_3f9;
  string local_3f8;
  anon_class_8_1_8991fb9c_for_m_f local_3d8;
  Proxy_Function local_3d0;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_3c0;
  Options local_3b4;
  Options *local_3b0;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_3a8;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_3a0;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_398;
  Options local_38c;
  Options *local_388;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_380;
  __normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
  local_378;
  allocator<char> local_369;
  string local_368;
  anon_class_8_1_8991fb9c_for_m_f local_348;
  Proxy_Function local_340;
  allocator<char> local_329;
  string local_328;
  anon_class_8_1_8991fb9c_for_m_f local_308;
  Proxy_Function local_300;
  allocator<char> local_2e9;
  string local_2e8;
  anon_class_8_1_8991fb9c_for_m_f local_2c8;
  Proxy_Function local_2c0;
  allocator<char> local_2a9;
  string local_2a8;
  anon_class_8_1_8991fb9c_for_m_f local_288;
  Proxy_Function local_280;
  allocator<char> local_269;
  string local_268;
  anon_class_8_1_8991fb9c_for_m_f local_248;
  Proxy_Function local_240;
  allocator<char> local_229;
  string local_228;
  anon_class_8_1_8991fb9c_for_m_f local_208;
  Proxy_Function local_200;
  allocator<char> local_1e9;
  string local_1e8;
  anon_class_8_1_8991fb9c_for_m_f local_1c8;
  Proxy_Function local_1c0;
  allocator<char> local_1a9;
  string local_1a8;
  anon_class_8_1_8991fb9c_for_m_f local_188;
  Proxy_Function local_180;
  allocator<char> local_169;
  string local_168;
  anon_class_8_1_8991fb9c_for_m_f local_148;
  Proxy_Function local_140;
  allocator<char> local_129;
  string local_128;
  anon_class_8_1_8991fb9c_for_m_f local_108;
  Proxy_Function local_100;
  allocator<char> local_e9;
  string local_e8;
  anon_class_8_1_8991fb9c_for_m_f local_c8;
  Proxy_Function local_c0;
  allocator<char> local_a9;
  string local_a8;
  anon_class_8_1_8991fb9c_for_m_f local_88;
  Proxy_Function local_80 [2];
  allocator<char> local_59;
  string local_58;
  anon_class_8_1_8991fb9c_for_m_f local_38;
  Proxy_Function local_30;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *local_20;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *t_opts_local;
  ModulePtr *t_lib_local;
  ChaiScript_Basic *this_local;
  
  local_20 = t_opts;
  t_opts_local = (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)t_lib;
  t_lib_local = (ModulePtr *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)t_lib);
  if (bVar1) {
    add(this,(ModulePtr *)t_opts_local);
  }
  local_38.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_1_>
            ((chaiscript *)&local_30,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"dump_system",&local_59);
  detail::Dispatch_Engine::add(&this->m_engine,&local_30,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_30);
  local_88.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&)_1_>
            ((chaiscript *)local_80,&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"dump_object",&local_a9);
  detail::Dispatch_Engine::add(&this->m_engine,local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_80);
  local_c8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_1_>
            ((chaiscript *)&local_c0,&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"is_type",&local_e9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_c0);
  local_108.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&)_2_>
            ((chaiscript *)&local_100,&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"type_name",&local_129);
  detail::Dispatch_Engine::add(&this->m_engine,&local_100,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_100);
  local_148.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_1_>
            ((chaiscript *)&local_140,&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"function_exists",&local_169);
  detail::Dispatch_Engine::add(&this->m_engine,&local_140,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_140);
  local_188.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_2_>
            ((chaiscript *)&local_180,&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"get_functions",&local_1a9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_180,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_180);
  local_1c8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda()_3_>
            ((chaiscript *)&local_1c0,&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"get_objects",&local_1e9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_1c0,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1c0);
  local_208.this = this;
  dispatch::
  make_dynamic_proxy_function<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Function_Params_const&)_1_>
            ((dispatch *)&local_200,&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"call_exists",&local_229);
  detail::Dispatch_Engine::add(&this->m_engine,&local_200,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_200);
  local_248.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_>
            ((chaiscript *)&local_240,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"call",&local_269);
  detail::Dispatch_Engine::add(&this->m_engine,&local_240,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_240);
  local_288.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Type_Info_const&)_1_>
            ((chaiscript *)&local_280,&local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"name",&local_2a9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_280,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_280);
  local_2c8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,bool)_1_>
            ((chaiscript *)&local_2c0,&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"type",&local_2e9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2c0);
  local_308.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_2_>
            ((chaiscript *)&local_300,&local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"type",&local_329);
  detail::Dispatch_Engine::add(&this->m_engine,&local_300,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_300);
  local_348.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&)_1_>
            ((chaiscript *)&local_340,&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"add_type_conversion",&local_369);
  detail::Dispatch_Engine::add(&this->m_engine,&local_340,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_340);
  local_380._M_current =
       (Options *)
       std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::begin(local_20);
  local_388 = (Options *)
              std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
  local_38c = No_Load_Modules;
  local_378 = std::
              find<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,chaiscript::Options>
                        (local_380,
                         (__normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                          )local_388,&local_38c);
  local_398._M_current =
       (Options *)
       std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
  bVar1 = __gnu_cxx::
          operator==<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                    (&local_378,&local_398);
  local_829 = 0;
  if (bVar1) {
    local_3a8._M_current =
         (Options *)
         std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::begin(local_20);
    local_3b0 = (Options *)
                std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end
                          (local_20);
    local_3b4 = Load_Modules;
    local_3a0 = std::
                find<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,chaiscript::Options>
                          (local_3a8,
                           (__normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                            )local_3b0,&local_3b4);
    local_3c0._M_current =
         (Options *)
         std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                      (&local_3a0,&local_3c0);
    local_829 = bVar1 ^ 0xff;
  }
  if ((local_829 & 1) != 0) {
    local_3d8.this = this;
    fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,std::__cxx11::string_const&)_1_>
              ((chaiscript *)&local_3d0,&local_3d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f8,"load_module",&local_3f9);
    detail::Dispatch_Engine::add(&this->m_engine,&local_3d0,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator(&local_3f9);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3d0);
    local_418.this = this;
    fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_3_>
              ((chaiscript *)&local_410,&local_418);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,"load_module",&local_439);
    detail::Dispatch_Engine::add(&this->m_engine,&local_410,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_410);
  }
  local_450._M_current =
       (Options *)
       std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::begin(local_20);
  local_458 = (Options *)
              std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
  local_45c = No_External_Scripts;
  local_448 = std::
              find<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,chaiscript::Options>
                        (local_450,
                         (__normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                          )local_458,&local_45c);
  local_468._M_current =
       (Options *)
       std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
  bVar1 = __gnu_cxx::
          operator==<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                    (&local_448,&local_468);
  local_851 = 0;
  if (bVar1) {
    local_478._M_current =
         (Options *)
         std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::begin(local_20);
    local_480 = (Options *)
                std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end
                          (local_20);
    local_484 = External_Scripts;
    local_470 = std::
                find<__gnu_cxx::__normal_iterator<chaiscript::Options_const*,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>>,chaiscript::Options>
                          (local_478,
                           (__normal_iterator<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                            )local_480,&local_484);
    local_490._M_current =
         (Options *)
         std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::end(local_20);
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::Options_*,_std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>_>
                      (&local_470,&local_490);
    local_851 = bVar1 ^ 0xff;
  }
  if ((local_851 & 1) != 0) {
    local_4a8.this = this;
    fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_4_>
              ((chaiscript *)&local_4a0,&local_4a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"use",&local_4c9);
    detail::Dispatch_Engine::add(&this->m_engine,&local_4a0,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4a0);
    local_4e8.this = this;
    fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_5_>
              ((chaiscript *)&local_4e0,&local_4e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"eval_file",&local_509);
    detail::Dispatch_Engine::add(&this->m_engine,&local_4e0,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4e0);
  }
  local_528.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_6_>
            ((chaiscript *)&local_520,&local_528);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"eval",&local_549);
  detail::Dispatch_Engine::add(&this->m_engine,&local_520,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_520);
  local_568.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::AST_Node_const&)_1_>
            ((chaiscript *)&local_560,&local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"eval",&local_589);
  detail::Dispatch_Engine::add(&this->m_engine,&local_560,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_560);
  local_5a8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&,bool)_2_>
            ((chaiscript *)&local_5a0,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"parse",&local_5c9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_5a0,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5a0);
  local_5e8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_7_>
            ((chaiscript *)&local_5e0,&local_5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"parse",&local_609);
  detail::Dispatch_Engine::add(&this->m_engine,&local_5e0,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5e0);
  local_628.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_2_>
            ((chaiscript *)&local_620,&local_628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"add_global_const",&local_649);
  detail::Dispatch_Engine::add(&this->m_engine,&local_620,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_620);
  local_668.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_3_>
            ((chaiscript *)&local_660,&local_668);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"add_global",&local_689);
  detail::Dispatch_Engine::add(&this->m_engine,&local_660,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_660);
  local_6a8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(chaiscript::Boxed_Value_const&,std::__cxx11::string_const&)_4_>
            ((chaiscript *)&local_6a0,&local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"set_global",&local_6c9);
  detail::Dispatch_Engine::add(&this->m_engine,&local_6a0,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_6a0);
  local_6e8.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_8_>
            ((chaiscript *)&local_6e0,&local_6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"namespace",&local_709);
  detail::Dispatch_Engine::add(&this->m_engine,&local_6e0,&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_6e0);
  local_728.this = this;
  fun<chaiscript::ChaiScript_Basic::build_eval_system(std::shared_ptr<chaiscript::Module>const&,std::vector<chaiscript::Options,std::allocator<chaiscript::Options>>const&)::_lambda(std::__cxx11::string_const&)_9_>
            ((chaiscript *)&local_720,&local_728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"import",&local_749);
  detail::Dispatch_Engine::add(&this->m_engine,&local_720,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_720);
  return;
}

Assistant:

void build_eval_system(const ModulePtr &t_lib, const std::vector<Options> &t_opts) {
      if (t_lib) {
        add(t_lib);
      }

      m_engine.add(fun([this]() { m_engine.dump_system(); }), "dump_system");
      m_engine.add(fun([this](const Boxed_Value &t_bv) { m_engine.dump_object(t_bv); }), "dump_object");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_type) { return m_engine.is_type(t_bv, t_type); }), "is_type");
      m_engine.add(fun([this](const Boxed_Value &t_bv) { return m_engine.type_name(t_bv); }), "type_name");
      m_engine.add(fun([this](const std::string &t_f) { return m_engine.function_exists(t_f); }), "function_exists");
      m_engine.add(fun([this]() { return m_engine.get_function_objects(); }), "get_functions");
      m_engine.add(fun([this]() { return m_engine.get_scripting_objects(); }), "get_objects");

      m_engine.add(dispatch::make_dynamic_proxy_function([this](const Function_Params &t_params) { return m_engine.call_exists(t_params); }),
                   "call_exists");

      m_engine.add(fun([this](const dispatch::Proxy_Function_Base &t_fun, const std::vector<Boxed_Value> &t_params) -> Boxed_Value {
                     Type_Conversions_State s(this->m_engine.conversions(), this->m_engine.conversions().conversion_saves());
                     return t_fun(Function_Params{t_params}, s);
                   }),
                   "call");

      m_engine.add(fun([this](const Type_Info &t_ti) { return m_engine.get_type_name(t_ti); }), "name");

      m_engine.add(fun([this](const std::string &t_type_name, bool t_throw) { return m_engine.get_type(t_type_name, t_throw); }), "type");
      m_engine.add(fun([this](const std::string &t_type_name) { return m_engine.get_type(t_type_name, true); }), "type");

      m_engine.add(fun([this](const Type_Info &t_from, const Type_Info &t_to, const std::function<Boxed_Value(const Boxed_Value &)> &t_func) {
                     m_engine.add(chaiscript::type_conversion(t_from, t_to, t_func));
                   }),
                   "add_type_conversion");

      if (std::find(t_opts.begin(), t_opts.end(), Options::No_Load_Modules) == t_opts.end()
          && std::find(t_opts.begin(), t_opts.end(), Options::Load_Modules) != t_opts.end()) {
        m_engine.add(fun([this](const std::string &t_module, const std::string &t_file) { load_module(t_module, t_file); }), "load_module");
        m_engine.add(fun([this](const std::string &t_module) { return load_module(t_module); }), "load_module");
      }

      if (std::find(t_opts.begin(), t_opts.end(), Options::No_External_Scripts) == t_opts.end()
          && std::find(t_opts.begin(), t_opts.end(), Options::External_Scripts) != t_opts.end()) {
        m_engine.add(fun([this](const std::string &t_file) { return use(t_file); }), "use");
        m_engine.add(fun([this](const std::string &t_file) { return internal_eval_file(t_file); }), "eval_file");
      }

      m_engine.add(fun([this](const std::string &t_str) { return internal_eval(t_str); }), "eval");
      m_engine.add(fun([this](const AST_Node &t_ast) { return eval(t_ast); }), "eval");

      m_engine.add(fun([this](const std::string &t_str, const bool t_dump) { return parse(t_str, t_dump); }), "parse");
      m_engine.add(fun([this](const std::string &t_str) { return parse(t_str); }), "parse");

      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { add_global_const(t_bv, t_name); }), "add_global_const");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { add_global(t_bv, t_name); }), "add_global");
      m_engine.add(fun([this](const Boxed_Value &t_bv, const std::string &t_name) { set_global(t_bv, t_name); }), "set_global");

      // why this unused parameter to Namespace?
      m_engine.add(fun([this](const std::string &t_namespace_name) {
                     register_namespace([](Namespace & /*space*/) noexcept {}, t_namespace_name);
                     import(t_namespace_name);
                   }),
                   "namespace");
      m_engine.add(fun([this](const std::string &t_namespace_name) { import(t_namespace_name); }), "import");
    }